

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digraph.h
# Opt level: O0

bool __thiscall DegreeComp::operator()(DegreeComp *this,VertexIdx u,VertexIdx v)

{
  long lVar1;
  long lVar2;
  VertexIdx degv;
  VertexIdx degu;
  VertexIdx v_local;
  VertexIdx u_local;
  DegreeComp *this_local;
  
  if ((-1 < u) && (-1 < v)) {
    lVar1 = this->g->offsets[u + 1] - this->g->offsets[u];
    lVar2 = this->g->offsets[v + 1] - this->g->offsets[v];
    if ((lVar1 < lVar2) || ((lVar1 == lVar2 && (u < v)))) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  printf("Something wrong in DegreeComp, negative vertices. u is %lld, v is %lld\n",u,v);
  exit(1);
}

Assistant:

bool operator()(VertexIdx u, VertexIdx v) {
        if (u < 0 || v < 0) // something wrong, so print error message, and exit
        {
            printf("Something wrong in DegreeComp, negative vertices. u is %lld, v is %lld\n", u, v);
            exit(EXIT_FAILURE);
        }
        VertexIdx degu = g->offsets[u + 1] - g->offsets[u];  // Degree of u
        VertexIdx degv = g->offsets[v + 1] - g->offsets[v];  // Degree of v

        if (degu < degv || (degu == degv && u < v))    // Comparing degrees and breaking ties by id
            return true;
        else
            return false;
    }